

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  byte *dstEnd;
  ZSTD_strategy strategy;
  seqDef *sequences;
  seqDef *psVar1;
  BYTE *src;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  int disableLiteralCompression;
  size_t sVar2;
  size_t sVar3;
  uint suspectUncompressible;
  ulong nbSeq;
  ulong srcSize_00;
  size_t err_code;
  byte *pbVar4;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar1 = seqStorePtr->sequences;
  nbSeq = (long)psVar1 - (long)sequences >> 3;
  src = seqStorePtr->litStart;
  srcSize_00 = (long)seqStorePtr->lit - (long)src;
  strategy = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  if (psVar1 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < srcSize_00 / nbSeq);
  }
  disableLiteralCompression = ZSTD_literalsCompressionIsDisabled(cctxParams);
  sVar2 = ZSTD_compressLiterals
                    (dst,dstCapacity,src,srcSize_00,(void *)((long)entropyWorkspace + 0xd4),0x2204,
                     &prevEntropy->huf,&nextEntropy->huf,strategy,disableLiteralCompression,
                     suspectUncompressible,(int)entropyWkspSize);
  if (sVar2 < 0xffffffffffffff89) {
    if (dstCapacity < sVar2) {
      __assert_fail("cSize <= dstCapacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xb40,
                    "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                   );
    }
    if ((long)(dstCapacity - sVar2) < 4) {
      sVar2 = 0xffffffffffffffba;
    }
    else {
      dstEnd = (byte *)((long)dst + dstCapacity);
      pbVar4 = (byte *)(sVar2 + (long)dst);
      if (nbSeq < 0x80) {
        *pbVar4 = (byte)nbSeq;
        pbVar4 = pbVar4 + 1;
      }
      else if (nbSeq < 0x7f00) {
        *pbVar4 = (byte)(nbSeq >> 8) | 0x80;
        pbVar4[1] = (byte)nbSeq;
        pbVar4 = pbVar4 + 2;
      }
      else {
        *pbVar4 = 0xff;
        *(short *)(pbVar4 + 1) = (short)nbSeq + -0x7f00;
        pbVar4 = pbVar4 + 3;
      }
      if (dstEnd < pbVar4) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xb52,
                      "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                     );
      }
      nextEntropy_00 = &nextEntropy->fse;
      if (psVar1 == sequences) {
        memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
      }
      else {
        ZSTD_buildSequencesStatistics
                  (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar4 + 1,dstEnd,
                   strategy,(uint *)entropyWorkspace,(void *)((long)entropyWorkspace + 0xd4),0x2204)
        ;
        sVar2 = stats.size;
        if (0xffffffffffffff88 < stats.size) goto LAB_0062f360;
        *pbVar4 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) +
                  (char)stats.MLtype * '\x04';
        pbVar4 = pbVar4 + 1 + stats.size;
        sVar2 = ZSTD_encodeSequences
                          (pbVar4,(long)dstEnd - (long)pbVar4,(nextEntropy->fse).matchlengthCTable,
                           mlCodeTable,nextEntropy_00->offcodeCTable,ofCodeTable,
                           (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                           stats.longOffsets,(int)entropyWkspSize);
        if (0xffffffffffffff88 < sVar2) goto LAB_0062f360;
        pbVar4 = pbVar4 + sVar2;
        if (dstEnd < pbVar4) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xb70,
                        "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                       );
        }
        if ((stats.lastCountSize != 0) && (sVar2 + stats.lastCountSize < 4)) {
          if (sVar2 + stats.lastCountSize == 3) {
            return 0;
          }
          __assert_fail("lastCountSize + bitstreamSize == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xb7b,
                        "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                       );
        }
      }
      sVar2 = (long)pbVar4 - (long)dst;
      if (sVar2 == 0) {
        return 0;
      }
    }
  }
LAB_0062f360:
  if ((dstCapacity < srcSize) || (sVar2 != 0xffffffffffffffba)) {
    if (0xffffffffffffff88 < sVar2) {
      return sVar2;
    }
    sVar3 = ZSTD_minGain(srcSize,(cctxParams->cParams).strategy);
    if (sVar2 < srcSize - sVar3) {
      if (0x1ffff < sVar2) {
        __assert_fail("cSize < ZSTD_BLOCKSIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xba7,
                      "size_t ZSTD_entropyCompressSeqStore(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, size_t, void *, size_t, int)"
                     );
      }
      return sVar2;
    }
  }
  return 0;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}